

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank_parser.cc
# Opt level: O2

void __thiscall rank::parser::Parser::RC(Parser *this,int d)

{
  bool bVar1;
  Rank *pRVar2;
  int d_00;
  
  d_00 = d + 1;
  do {
    if (this->_token_available != true) {
      return;
    }
    if ((this->_token)._type != TK_Comma) {
      return;
    }
    advance(this);
    bVar1 = advance_if(this,TK_LBracket);
    if (!bVar1) break;
    pRVar2 = RankList::rank((this->_problem)._M_t.
                            super___uniq_ptr_impl<rank::RankList,_std::default_delete<rank::RankList>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_rank::RankList_*,_std::default_delete<rank::RankList>_>
                            .super__Head_base<0UL,_rank::RankList_*,_false>._M_head_impl);
    this->_rank = pRVar2;
    L(this,d_00);
    this->_rank = (Rank *)0x0;
    bVar1 = advance_if(this,TK_RBracket);
    d_00 = d_00 + 1;
  } while (bVar1);
  this->_ok = false;
  return;
}

Assistant:

void Parser::RC(int d) {

        if (token_available()  && _token.type() == TK_Comma) { // E -> ident X

#ifdef LOG_PRODUCTIONS
            std::cerr << std::string(4*d,'.') << "RC -> ',' '[' L ']' RC" << std::endl;
#endif

            advance();

            if (!advance_if(TK_LBracket)) { _ok=false;  return; }

            {
                _rank = _problem->rank(); // new rank
            }

            L(d+1);

            {
                _rank = nullptr; // new rank
            }


            if (!advance_if(TK_RBracket)) { _ok=false;  return; }

            RC(d+1);

        } 
        else {
#ifdef LOG_PRODUCTIONS
            std::cerr << std::string(4*d,'.') << "RC -> empty" << std::endl;
#endif
        }

    }